

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateDefaultConstructorCall
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,ExprBase *pointer)

{
  Allocator *pAVar1;
  bool bVar2;
  int iVar3;
  TypeBase *pTVar4;
  undefined4 extraout_var;
  ExprBase *pEVar5;
  InplaceStr name;
  InplaceStr name_00;
  ArrayView<FunctionValue> functions_00;
  SmallArray<FunctionValue,_32U> functions;
  
  pTVar4 = pointer->type;
  if ((pTVar4 == (TypeBase *)0x0) ||
     ((pTVar4->typeID != 0x12 && ((pTVar4 == (TypeBase *)0x0 || (pTVar4->typeID != 0x14)))))) {
    __assert_fail("isType<TypeRef>(pointer->type) || isType<TypeUnsizedArray>(pointer->type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x2747,
                  "ExprBase *CreateDefaultConstructorCall(ExpressionContext &, SynBase *, TypeBase *, ExprBase *)"
                 );
  }
  if ((type == (TypeBase *)0x0) ||
     ((type->typeID != 0x13 && ((type == (TypeBase *)0x0 || (type->typeID != 0x14)))))) {
    pEVar5 = CreateConstructorAccess(ctx,source,type,true,pointer);
    if (pEVar5 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    pAVar1 = ctx->allocator;
    memset(functions.little,0,0x300);
    functions.count = 0;
    functions.max = 0x20;
    functions.data = functions.little;
    functions.allocator = pAVar1;
    GetNodeFunctions(ctx,source,pEVar5,&functions);
    functions_00.count = functions.count;
    functions_00.data = functions.data;
    functions_00._12_4_ = 0;
    pEVar5 = CreateFunctionCallOverloaded
                       (ctx,source,pEVar5,functions_00,(IntrusiveList<TypeHandle>)ZEXT816(0),
                        (SynCallArgument *)0x0,false);
    SmallArray<FunctionValue,_32U>::~SmallArray(&functions);
    return pEVar5;
  }
  if ((type == (TypeBase *)0x0) || (pTVar4 = type, type->typeID != 0x13)) {
    pTVar4 = (TypeBase *)0x0;
  }
  if (pTVar4 == (TypeBase *)0x0) {
    if ((type == (TypeBase *)0x0) || (pTVar4 = type, type->typeID != 0x14)) {
      pTVar4 = (TypeBase *)0x0;
    }
    if (pTVar4 == (TypeBase *)0x0) goto LAB_001fbb02;
    pTVar4 = (TypeBase *)&pTVar4[1].typeIndex;
  }
  else {
    pTVar4 = pTVar4 + 1;
  }
  type = (TypeBase *)pTVar4->_vptr_TypeBase;
LAB_001fbb02:
  bVar2 = HasDefaultConstructor(ctx,source,type);
  if (!bVar2) {
    return (ExprBase *)0x0;
  }
  pTVar4 = pointer->type;
  if ((pTVar4 == (TypeBase *)0x0) || (pTVar4->typeID != 0x12)) {
    pTVar4 = (TypeBase *)0x0;
  }
  if (pTVar4 == (TypeBase *)0x0) {
    name_00.end = "";
    name_00.begin = "__init_array";
    pEVar5 = CreateFunctionCall1(ctx,source,name_00,pointer,false,true,true);
    return pEVar5;
  }
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
  pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar3);
  pTVar4 = (TypeBase *)pTVar4[1]._vptr_TypeBase;
  pEVar5->typeID = 0x16;
  pEVar5->source = source;
  pEVar5->type = pTVar4;
  pEVar5->next = (ExprBase *)0x0;
  pEVar5->listed = false;
  pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6520;
  pEVar5[1]._vptr_ExprBase = (_func_int **)pointer;
  name.end = "";
  name.begin = "__init_array";
  pEVar5 = CreateFunctionCall1(ctx,source,name,pEVar5,false,true,true);
  return pEVar5;
}

Assistant:

ExprBase* CreateDefaultConstructorCall(ExpressionContext &ctx, SynBase *source, TypeBase *type, ExprBase *pointer)
{
	assert(isType<TypeRef>(pointer->type) || isType<TypeUnsizedArray>(pointer->type));

	if(isType<TypeArray>(type) || isType<TypeUnsizedArray>(type))
	{
		if(TypeArray *arrType = getType<TypeArray>(type))
			type = arrType->subType;
		else if(TypeUnsizedArray *arrType = getType<TypeUnsizedArray>(type))
			type = arrType->subType;

		if(HasDefaultConstructor(ctx, source, type))
		{
			if(TypeRef *typeRef = getType<TypeRef>(pointer->type))
				return CreateFunctionCall1(ctx, source, InplaceStr("__init_array"), new (ctx.get<ExprDereference>()) ExprDereference(source, typeRef->subType, pointer), false, true, true);

			return CreateFunctionCall1(ctx, source, InplaceStr("__init_array"), pointer, false, true, true);
		}

		return NULL;
	}

	if(ExprBase *constructor = CreateConstructorAccess(ctx, source, type, true, pointer))
	{
		// Collect a set of available functions
		SmallArray<FunctionValue, 32> functions(ctx.allocator);

		GetNodeFunctions(ctx, source, constructor, functions);

		return CreateFunctionCallOverloaded(ctx, source, constructor, functions, IntrusiveList<TypeHandle>(), NULL, false);
	}

	return NULL;
}